

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_create.c
# Opt level: O0

mpt_metatype * mpt_iterator_create(char *conf)

{
  int iVar1;
  ushort **ppuVar2;
  int *piVar3;
  bool bVar4;
  char local_59 [8];
  char curr;
  char buf [32];
  ulong local_30;
  size_t len;
  mpt_value val;
  char *conf_local;
  
  val._type = (mpt_type_t)conf;
  memset(&len,0,0x10);
  if (val._type == 0) {
    conf_local = (char *)_mpt_iterator_range((mpt_value *)0x0);
  }
  else {
    while( true ) {
      bVar4 = false;
      if (*(char *)val._type != '\0') {
        ppuVar2 = __ctype_b_loc();
        bVar4 = ((*ppuVar2)[(int)*(char *)val._type] & 0x2000) != 0;
      }
      if (!bVar4) break;
      val._type = val._type + 1;
    }
    local_59[0] = *(char *)val._type;
    if (local_59[0] == '\0') {
      conf_local = (char *)_mpt_iterator_range((mpt_value *)0x0);
    }
    else {
      local_30 = 0;
      while( true ) {
        ppuVar2 = __ctype_b_loc();
        bVar4 = true;
        if (((*ppuVar2)[(int)local_59[0]] & 0x100) == 0) {
          ppuVar2 = __ctype_b_loc();
          bVar4 = ((*ppuVar2)[(int)local_59[0]] & 0x200) != 0;
        }
        if (!bVar4) break;
        local_59[0] = *(char *)(val._type + local_30);
        local_30 = local_30 + 1;
      }
      if (local_30 < 0x20) {
        if (local_30 == 0) {
          conf_local = (char *)mpt_iterator_values((char *)val._type);
        }
        else {
          memcpy(local_59 + 1,(void *)val._type,local_30 - 1);
          local_59[local_30] = '\0';
          val._type = (local_30 - 1) + val._type;
          len = (size_t)&val._type;
          val._addr = (void *)0x73;
          iVar1 = strcasecmp(local_59 + 1,"linear");
          if ((iVar1 == 0) || (iVar1 = strcasecmp(local_59 + 1,"lin"), iVar1 == 0)) {
            conf_local = (char *)_mpt_iterator_linear((mpt_value *)&len);
          }
          else {
            iVar1 = strcasecmp(local_59 + 1,"factor");
            if ((iVar1 == 0) ||
               ((iVar1 = strcasecmp(local_59 + 1,"fact"), iVar1 == 0 ||
                (iVar1 = strcasecmp(local_59 + 1,"fac"), iVar1 == 0)))) {
              conf_local = (char *)_mpt_iterator_factor((mpt_value *)&len);
            }
            else {
              iVar1 = strcasecmp(local_59 + 1,"range");
              if (iVar1 == 0) {
                conf_local = (char *)_mpt_iterator_range((mpt_value *)&len);
              }
              else {
                piVar3 = __errno_location();
                *piVar3 = 0x16;
                conf_local = (char *)0x0;
              }
            }
          }
        }
      }
      else {
        piVar3 = __errno_location();
        *piVar3 = 0x16;
        conf_local = (char *)0x0;
      }
    }
  }
  return (mpt_metatype *)conf_local;
}

Assistant:

extern MPT_INTERFACE(metatype) *mpt_iterator_create(const char *conf)
{
	MPT_STRUCT(value) val = MPT_VALUE_INIT(0, 0);
	size_t len;
	char buf[32];
	char curr;
	
	if (!conf) {
		return _mpt_iterator_range(0);
	}
	/* consume whitespace */
	while (*conf && isspace(*conf)) {
		conf++;
	}
	if (!(curr = *conf)) {
		return _mpt_iterator_range(0);
	}
	/* extract description string */
	len = 0;
	while ((isupper(curr) || islower(curr))) {
		curr = conf[len++];
	}
	if (len >= sizeof(buf)) {
		errno = EINVAL;
		return 0;
	}
	/* no description -> use normal values */
	if (!len--) {
		return mpt_iterator_values(conf);
	}
	
	memcpy(buf, conf, len);
	buf[len] = 0;
	
	conf += len;
	MPT_value_set(&val, 's', &conf);
	
	/* create matching iterators */
	if (!strcasecmp(buf, "linear")
	 || !strcasecmp(buf, "lin")) {
		return _mpt_iterator_linear(&val);
	}
	if (!strcasecmp(buf, "factor")
	 || !strcasecmp(buf, "fact")
	 || !strcasecmp(buf, "fac")) {
		return _mpt_iterator_factor(&val);
	}
	if (!strcasecmp(buf, "range")) {
		return _mpt_iterator_range(&val);
	}
	/* unknown value iterator type */
	errno = EINVAL;
	return 0;
}